

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_shrinkstack(lua_State *L,MSize used)

{
  MSize used_local;
  lua_State *L_local;
  
  if ((((L->stacksize < 0xffe5) && (used << 2 < L->stacksize)) && (0x5e < L->stacksize)) &&
     ((*(long *)((L->glref).ptr64 + 0x178) == 0 || (L != *(lua_State **)((L->glref).ptr64 + 0x170)))
     )) {
    resizestack(L,L->stacksize >> 1);
  }
  return;
}

Assistant:

void lj_state_shrinkstack(lua_State *L, MSize used)
{
  if (L->stacksize > LJ_STACK_MAXEX)
    return;  /* Avoid stack shrinking while handling stack overflow. */
  if (4*used < L->stacksize &&
      2*(LJ_STACK_START+LJ_STACK_EXTRA) < L->stacksize &&
      /* Don't shrink stack of live trace. */
      (tvref(G(L)->jit_base) == NULL || obj2gco(L) != gcref(G(L)->cur_L)))
    resizestack(L, L->stacksize >> 1);
}